

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int intern_device_id(cubeb_conflict *ctx,char **id)

{
  char *pcVar1;
  cubeb_strings *in_RSI;
  char *interned;
  char *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  pcVar1 = cubeb_strings_intern(in_RSI,in_stack_ffffffffffffffe0);
  if (pcVar1 == (char *)0x0) {
    local_4 = -1;
  }
  else {
    *(char **)in_RSI = pcVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
intern_device_id(cubeb * ctx, char const ** id)
{
  char const * interned;

  assert(ctx);
  assert(id);

  interned = cubeb_strings_intern(ctx->device_ids, *id);
  if (!interned) {
    return CUBEB_ERROR;
  }

  *id = interned;

  return CUBEB_OK;
}